

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderCase.cpp
# Opt level: O0

int __thiscall deqp::gls::RandomShaderCase::init(RandomShaderCase *this,EVP_PKEY_CTX *ctx)

{
  value_type vVar1;
  int iVar2;
  short sVar3;
  short sVar4;
  bool bVar5;
  deBool dVar6;
  Type TVar7;
  int iVar8;
  int iVar9;
  int extraout_EAX;
  vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *this_00;
  reference ppSVar10;
  VariableType *pVVar11;
  char *__s;
  TestError *this_01;
  vector<float,_std::allocator<float>_> *this_02;
  reference pvVar12;
  pointer pVVar13;
  Variable *pVVar14;
  Texture2D *tex2D;
  TextureCube *texCube;
  ConstStridedValueAccess<1> CVar15;
  ConstValueAccess CVar16;
  VariableType local_258;
  VariableType local_208;
  ConstValueAccess local_1b8;
  int local_1a4;
  VariableType *pVStack_1a0;
  int unitNdx;
  VariableType *type;
  __normal_iterator<rsg::VariableValue_*,_std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>_>
  local_190;
  __normal_iterator<const_rsg::VariableValue_*,_std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>_>
  local_188;
  const_iterator uniformIter;
  int quadX;
  int quadY;
  int quadNdx;
  int numIndices;
  int numQuads;
  float local_158;
  float f;
  float yd;
  float xd;
  Scalar *local_148;
  ConstStridedValueAccess<1> local_140;
  float local_12c;
  undefined1 auStack_128 [4];
  float maxVal;
  Scalar *local_120;
  ConstStridedValueAccess<1> local_118;
  float local_108;
  int local_104;
  float minVal;
  int compNdx;
  float *dst;
  float yf;
  float xf;
  int x;
  int y;
  int vtxNdx;
  byte local_b9;
  undefined1 local_b8 [7];
  bool isPosition;
  VertexArray vtxArray;
  undefined1 local_90 [4];
  int numComponents;
  ConstValueRangeAccess valueRange;
  ShaderInput *input;
  __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
  local_68;
  const_iterator i;
  int numVertices;
  vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *inputs;
  Random rnd;
  vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_> unifiedUniforms;
  ProgramGenerator local_11;
  RandomShaderCase *pRStack_10;
  ProgramGenerator programGenerator;
  RandomShaderCase *this_local;
  
  pRStack_10 = this;
  rsg::ProgramGenerator::ProgramGenerator(&local_11);
  rsg::ProgramGenerator::generate
            (&local_11,&this->m_parameters,&this->m_vertexShader,&this->m_fragmentShader);
  checkShaderLimits(this,&this->m_vertexShader);
  checkShaderLimits(this,&this->m_fragmentShader);
  checkProgramLimits(this,&this->m_vertexShader,&this->m_fragmentShader);
  std::vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>::vector
            ((vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_> *)
             &rnd.m_rnd.z);
  de::Random::Random((Random *)&inputs,(this->m_parameters).seed);
  rsg::computeUnifiedUniforms
            (&this->m_vertexShader,&this->m_fragmentShader,
             (vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_> *)
             &rnd.m_rnd.z);
  rsg::computeUniformValues
            ((Random *)&inputs,&this->m_uniforms,
             (vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_> *)
             &rnd.m_rnd.z);
  this_00 = rsg::Shader::getInputs(&this->m_vertexShader);
  i._M_current._4_4_ = (this->m_gridWidth + 1) * (this->m_gridHeight + 1);
  local_68._M_current =
       (ShaderInput **)
       std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::begin(this_00);
  do {
    input = (ShaderInput *)
            std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::end(this_00);
    bVar5 = __gnu_cxx::operator!=
                      (&local_68,
                       (__normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
                        *)&input);
    if (!bVar5) {
      iVar8 = this->m_gridWidth * this->m_gridHeight;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                (&this->m_indices,(long)(iVar8 * 6));
      for (quadX = 0; quadX < iVar8; quadX = quadX + 1) {
        iVar9 = quadX / this->m_gridWidth;
        uniformIter._M_current._4_4_ = quadX - iVar9 * this->m_gridWidth;
        iVar2 = this->m_gridWidth;
        sVar4 = (short)iVar9;
        sVar3 = (short)uniformIter._M_current._4_4_;
        pvVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                            (&this->m_indices,(long)(quadX * 6));
        *pvVar12 = sVar3 + sVar4 * ((short)iVar2 + 1);
        iVar2 = this->m_gridWidth;
        sVar3 = (short)uniformIter._M_current._4_4_;
        pvVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                            (&this->m_indices,(long)(quadX * 6 + 1));
        *pvVar12 = sVar3 + (sVar4 + 1) * ((short)iVar2 + 1);
        iVar2 = this->m_gridWidth;
        sVar3 = (short)uniformIter._M_current._4_4_;
        pvVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                            (&this->m_indices,(long)(quadX * 6 + 2));
        *pvVar12 = sVar3 + sVar4 * ((short)iVar2 + 1) + 1;
        pvVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                            (&this->m_indices,(long)(quadX * 6 + 2));
        vVar1 = *pvVar12;
        pvVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                            (&this->m_indices,(long)(quadX * 6 + 3));
        *pvVar12 = vVar1;
        pvVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                            (&this->m_indices,(long)(quadX * 6 + 1));
        vVar1 = *pvVar12;
        pvVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                            (&this->m_indices,(long)(quadX * 6 + 4));
        *pvVar12 = vVar1;
        iVar2 = this->m_gridWidth;
        sVar3 = (short)uniformIter._M_current._4_4_;
        pvVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                            (&this->m_indices,(long)(quadX * 6 + 5));
        *pvVar12 = sVar3 + (sVar4 + 1) * ((short)iVar2 + 1) + 1;
      }
      local_190._M_current =
           (VariableValue *)
           std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>::begin
                     (&this->m_uniforms);
      __gnu_cxx::
      __normal_iterator<rsg::VariableValue_const*,std::vector<rsg::VariableValue,std::allocator<rsg::VariableValue>>>
      ::__normal_iterator<rsg::VariableValue*>
                ((__normal_iterator<rsg::VariableValue_const*,std::vector<rsg::VariableValue,std::allocator<rsg::VariableValue>>>
                  *)&local_188,&local_190);
      while( true ) {
        type = (VariableType *)
               std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>::end
                         (&this->m_uniforms);
        bVar5 = __gnu_cxx::operator!=
                          (&local_188,
                           (__normal_iterator<rsg::VariableValue_*,_std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>_>
                            *)&type);
        if (!bVar5) break;
        pVVar13 = __gnu_cxx::
                  __normal_iterator<const_rsg::VariableValue_*,_std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>_>
                  ::operator->(&local_188);
        pVVar14 = rsg::VariableValue::getVariable(pVVar13);
        pVStack_1a0 = rsg::Variable::getType(pVVar14);
        bVar5 = rsg::VariableType::isSampler(pVStack_1a0);
        if (bVar5) {
          pVVar13 = __gnu_cxx::
                    __normal_iterator<const_rsg::VariableValue_*,_std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>_>
                    ::operator->(&local_188);
          CVar16 = rsg::VariableValue::getValue(pVVar13);
          local_1b8 = CVar16;
          local_1a4 = rsg::ConstStridedValueAccess<1>::asInt(&local_1b8,0);
          pVVar11 = pVStack_1a0;
          rsg::VariableType::VariableType(&local_208,TYPE_SAMPLER_2D,1);
          bVar5 = rsg::VariableType::operator==(pVVar11,&local_208);
          rsg::VariableType::~VariableType(&local_208);
          pVVar11 = pVStack_1a0;
          iVar8 = local_1a4;
          if (bVar5) {
            tex2D = getTex2D(this);
            TextureManager::bindTexture(&this->m_texManager,iVar8,tex2D);
          }
          else {
            rsg::VariableType::VariableType(&local_258,TYPE_SAMPLER_CUBE,1);
            bVar5 = rsg::VariableType::operator==(pVVar11,&local_258);
            rsg::VariableType::~VariableType(&local_258);
            iVar8 = local_1a4;
            if (bVar5) {
              texCube = getTexCube(this);
              TextureManager::bindTexture(&this->m_texManager,iVar8,texCube);
            }
          }
        }
        __gnu_cxx::
        __normal_iterator<const_rsg::VariableValue_*,_std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>_>
        ::operator++(&local_188,0);
      }
      de::Random::~Random((Random *)&inputs);
      std::vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>::~vector
                ((vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_> *)
                 &rnd.m_rnd.z);
      rsg::ProgramGenerator::~ProgramGenerator(&local_11);
      return extraout_EAX;
    }
    ppSVar10 = __gnu_cxx::
               __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
               ::operator*(&local_68);
    valueRange.m_max = (Scalar *)*ppSVar10;
    rsg::ShaderInput::getValueRange
              ((ConstValueRangeAccess *)local_90,(ShaderInput *)valueRange.m_max);
    pVVar14 = rsg::ShaderInput::getVariable((ShaderInput *)valueRange.m_max);
    pVVar11 = rsg::Variable::getType(pVVar14);
    vtxArray.m_vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = rsg::VariableType::getNumElements(pVVar11);
    VertexArray::VertexArray
              ((VertexArray *)local_b8,(ShaderInput *)valueRange.m_max,i._M_current._4_4_);
    pVVar14 = rsg::ShaderInput::getVariable((ShaderInput *)valueRange.m_max);
    __s = rsg::Variable::getName(pVVar14);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vtxNdx,__s,(allocator<char> *)((long)&y + 3));
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &vtxNdx,"dEQP_Position");
    std::__cxx11::string::~string((string *)&vtxNdx);
    std::allocator<char>::~allocator((allocator<char> *)((long)&y + 3));
    local_b9 = bVar5;
    do {
      dVar6 = ::deGetFalse();
      if (dVar6 != 0) {
LAB_00f05904:
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,(char *)0x0,
                   "input->getVariable()->getType().getBaseType() == rsg::VariableType::TYPE_FLOAT",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                   ,0xa5);
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      pVVar14 = rsg::ShaderInput::getVariable((ShaderInput *)valueRange.m_max);
      pVVar11 = rsg::Variable::getType(pVVar14);
      TVar7 = rsg::VariableType::getBaseType(pVVar11);
      if (TVar7 != TYPE_FLOAT) goto LAB_00f05904;
      dVar6 = ::deGetFalse();
    } while (dVar6 != 0);
    for (x = 0; x < i._M_current._4_4_; x = x + 1) {
      xf = (float)(x / (this->m_gridWidth + 1));
      yf = (float)(x - (int)xf * (this->m_gridWidth + 1));
      dst._4_4_ = (float)(int)yf / (float)this->m_gridWidth;
      dst._0_4_ = (float)(int)xf / (float)this->m_gridHeight;
      this_02 = VertexArray::getVertices((VertexArray *)local_b8);
      _minVal = std::vector<float,_std::allocator<float>_>::operator[]
                          (this_02,(long)(x * vtxArray.m_vertices.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage.
                                              _4_4_));
      if ((local_b9 & 1) == 0) {
        for (local_104 = 0;
            local_104 <
            vtxArray.m_vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_; local_104 = local_104 + 1) {
          CVar16 = rsg::ConstValueRangeAccess::getMin((ConstValueRangeAccess *)local_90);
          _auStack_128 = CVar16;
          CVar15 = rsg::ConstStridedValueAccess<1>::component
                             ((ConstStridedValueAccess<1> *)auStack_128,local_104);
          local_118 = CVar15;
          local_108 = rsg::ConstStridedValueAccess<1>::asFloat(&local_118);
          CVar16 = rsg::ConstValueRangeAccess::getMax((ConstValueRangeAccess *)local_90);
          _yd = CVar16;
          CVar15 = rsg::ConstStridedValueAccess<1>::component
                             ((ConstStridedValueAccess<1> *)&yd,local_104);
          local_140 = CVar15;
          local_12c = rsg::ConstStridedValueAccess<1>::asFloat(&local_140);
          rsg::getVertexInterpolationCoords(&f,&local_158,dst._4_4_,dst._0_4_,local_104);
          _minVal[local_104] = ((f + local_158) / 2.0) * (local_12c - local_108) + local_108;
        }
      }
      else {
        *_minVal = dst._4_4_ + dst._4_4_ + -1.0;
        _minVal[1] = 1.0 - (dst._0_4_ + dst._0_4_);
        _minVal[2] = 0.0;
        _minVal[3] = 1.0;
      }
    }
    std::vector<deqp::gls::VertexArray,_std::allocator<deqp::gls::VertexArray>_>::push_back
              (&this->m_vertexArrays,(value_type *)local_b8);
    VertexArray::~VertexArray((VertexArray *)local_b8);
    __gnu_cxx::
    __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
    ::operator++(&local_68,0);
  } while( true );
}

Assistant:

void RandomShaderCase::init (void)
{
	// Generate shaders
	rsg::ProgramGenerator programGenerator;
	programGenerator.generate(m_parameters, m_vertexShader, m_fragmentShader);

	checkShaderLimits(m_vertexShader);
	checkShaderLimits(m_fragmentShader);
	checkProgramLimits(m_vertexShader, m_fragmentShader);

	// Compute uniform values
	std::vector<const rsg::ShaderInput*>	unifiedUniforms;
	de::Random								rnd(m_parameters.seed);
	rsg::computeUnifiedUniforms(m_vertexShader, m_fragmentShader, unifiedUniforms);
	rsg::computeUniformValues(rnd, m_uniforms, unifiedUniforms);

	// Generate vertices
	const vector<rsg::ShaderInput*>&	inputs		= m_vertexShader.getInputs();
	int									numVertices	= (m_gridWidth+1)*(m_gridHeight+1);

	for (vector<rsg::ShaderInput*>::const_iterator i = inputs.begin(); i != inputs.end(); i++)
	{
		const rsg::ShaderInput*			input			= *i;
		rsg::ConstValueRangeAccess		valueRange		= input->getValueRange();
		int								numComponents	= input->getVariable()->getType().getNumElements();
		VertexArray						vtxArray(input, numVertices);
		bool							isPosition		= string(input->getVariable()->getName()) == "dEQP_Position";

		TCU_CHECK(input->getVariable()->getType().getBaseType() == rsg::VariableType::TYPE_FLOAT);

		for (int vtxNdx = 0; vtxNdx < numVertices; vtxNdx++)
		{
			int		y	= vtxNdx / (m_gridWidth+1);
			int		x	= vtxNdx - y*(m_gridWidth+1);
			float	xf	= (float)x / (float)m_gridWidth;
			float	yf	= (float)y / (float)m_gridHeight;
			float*	dst	= &vtxArray.getVertices()[vtxNdx*numComponents];

			if (isPosition)
			{
				// Position attribute gets special interpolation handling.
				DE_ASSERT(numComponents == 4);
				dst[0] = -1.0f + xf *  2.0f;
				dst[1] =  1.0f + yf * -2.0f;
				dst[2] = 0.0f;
				dst[3] = 1.0f;
			}
			else
			{
				for (int compNdx = 0; compNdx < numComponents; compNdx++)
				{
					float	minVal	= valueRange.getMin().component(compNdx).asFloat();
					float	maxVal	= valueRange.getMax().component(compNdx).asFloat();
					float	xd, yd;

					rsg::getVertexInterpolationCoords(xd, yd, xf, yf, compNdx);

					float	f		= (xd+yd) / 2.0f;

					dst[compNdx] = minVal + f * (maxVal-minVal);
				}
			}
		}

		m_vertexArrays.push_back(vtxArray);
	}

	// Generate indices
	int numQuads	= m_gridWidth*m_gridHeight;
	int numIndices	= numQuads*6;
	m_indices.resize(numIndices);
	for (int quadNdx = 0; quadNdx < numQuads; quadNdx++)
	{
		int	quadY	= quadNdx / (m_gridWidth);
		int quadX	= quadNdx - quadY*m_gridWidth;

		m_indices[quadNdx*6+0] = (deUint16)(quadX + quadY*(m_gridWidth+1));
		m_indices[quadNdx*6+1] = (deUint16)(quadX + (quadY+1)*(m_gridWidth+1));
		m_indices[quadNdx*6+2] = (deUint16)(quadX + quadY*(m_gridWidth+1) + 1);
		m_indices[quadNdx*6+3] = (deUint16)(m_indices[quadNdx*6+2]);
		m_indices[quadNdx*6+4] = (deUint16)(m_indices[quadNdx*6+1]);
		m_indices[quadNdx*6+5] = (deUint16)(quadX + (quadY+1)*(m_gridWidth+1) + 1);
	}

	// Create textures.
	for (vector<rsg::VariableValue>::const_iterator uniformIter = m_uniforms.begin(); uniformIter != m_uniforms.end(); uniformIter++)
	{
		const rsg::VariableType& type = uniformIter->getVariable()->getType();

		if (!type.isSampler())
			continue;

		int unitNdx = uniformIter->getValue().asInt(0);

		if (type == rsg::VariableType(rsg::VariableType::TYPE_SAMPLER_2D, 1))
			m_texManager.bindTexture(unitNdx, getTex2D());
		else if (type == rsg::VariableType(rsg::VariableType::TYPE_SAMPLER_CUBE, 1))
			m_texManager.bindTexture(unitNdx, getTexCube());
		else
			DE_ASSERT(DE_FALSE);
	}
}